

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  J_COLOR_SPACE JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  short *psVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  
  p_Var2 = cinfo->cquantize[1].finish_pass;
  iVar15 = boxp->c0min;
  iVar16 = boxp->c0max;
  iVar4 = boxp->c1min;
  lVar5 = (long)iVar4;
  iVar12 = boxp->c1max;
  iVar8 = boxp->c2min;
  lVar9 = (long)iVar8;
  iVar13 = boxp->c2max;
  if (iVar15 < iVar16) {
    lVar17 = (long)iVar15;
    do {
      if (iVar4 <= iVar12) {
        lVar7 = *(long *)(p_Var2 + lVar17 * 8) + lVar5 * 0x40 + lVar9 * 2;
        lVar11 = lVar5;
        do {
          if (iVar8 <= iVar13) {
            lVar14 = 0;
            do {
              if (*(short *)(lVar7 + lVar14 * 2) != 0) {
                iVar15 = (int)lVar17;
                boxp->c0min = iVar15;
                goto LAB_001332f3;
              }
              lVar14 = lVar14 + 1;
            } while ((iVar13 - iVar8) + 1 != (int)lVar14);
          }
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + 0x40;
        } while (iVar12 + 1 != (int)lVar11);
      }
      lVar17 = lVar17 + 1;
    } while (iVar16 + 1 != (int)lVar17);
  }
LAB_001332f3:
  if (iVar15 < iVar16) {
    lVar17 = (long)iVar16;
    do {
      if (iVar4 <= iVar12) {
        lVar7 = *(long *)(p_Var2 + lVar17 * 8) + lVar5 * 0x40 + lVar9 * 2;
        lVar11 = lVar5;
        do {
          if (iVar8 <= iVar13) {
            lVar14 = 0;
            do {
              if (*(short *)(lVar7 + lVar14 * 2) != 0) {
                iVar16 = (int)lVar17;
                boxp->c0max = iVar16;
                goto LAB_00133373;
              }
              lVar14 = lVar14 + 1;
            } while ((iVar13 - iVar8) + 1 != (int)lVar14);
          }
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + 0x40;
        } while (iVar12 + 1 != (int)lVar11);
      }
      bVar3 = iVar15 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar3);
  }
LAB_00133373:
  if (iVar4 < iVar12) {
    lVar17 = lVar5 * 0x40 + lVar9 * 2;
    do {
      lVar11 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar8 <= iVar13) {
            lVar7 = 0;
            do {
              if (*(short *)(*(long *)(p_Var2 + lVar11 * 8) + lVar17 + lVar7 * 2) != 0) {
                iVar4 = (int)lVar5;
                boxp->c1min = iVar4;
                goto LAB_001333ea;
              }
              lVar7 = lVar7 + 1;
            } while ((iVar13 - iVar8) + 1 != (int)lVar7);
          }
          lVar11 = lVar11 + 1;
        } while (iVar16 + 1 != (int)lVar11);
      }
      lVar5 = lVar5 + 1;
      lVar17 = lVar17 + 0x40;
    } while (iVar12 + 1 != (int)lVar5);
  }
LAB_001333ea:
  if (iVar4 < iVar12) {
    lVar5 = (long)iVar12 * 0x40 + lVar9 * 2;
    lVar17 = (long)iVar12;
    do {
      lVar11 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar8 <= iVar13) {
            lVar7 = 0;
            do {
              if (*(short *)(*(long *)(p_Var2 + lVar11 * 8) + lVar5 + lVar7 * 2) != 0) {
                iVar12 = (int)lVar17;
                boxp->c1max = iVar12;
                goto LAB_0013346b;
              }
              lVar7 = lVar7 + 1;
            } while ((iVar13 - iVar8) + 1 != (int)lVar7);
          }
          lVar11 = lVar11 + 1;
        } while (iVar16 + 1 != (int)lVar11);
      }
      lVar5 = lVar5 + -0x40;
      bVar3 = iVar4 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar3);
  }
LAB_0013346b:
  if (iVar8 < iVar13) {
    do {
      lVar5 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar4 <= iVar12) {
            psVar6 = (short *)(*(long *)(p_Var2 + lVar5 * 8) + (long)iVar4 * 0x40 + lVar9 * 2);
            iVar10 = (iVar12 - iVar4) + 1;
            do {
              if (*psVar6 != 0) {
                iVar8 = (int)lVar9;
                boxp->c2min = iVar8;
                goto LAB_001334d9;
              }
              psVar6 = psVar6 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (iVar16 + 1 != (int)lVar5);
      }
      lVar9 = lVar9 + 1;
    } while (iVar13 + 1 != (int)lVar9);
  }
LAB_001334d9:
  if (iVar8 < iVar13) {
    lVar5 = (long)iVar13;
    do {
      lVar9 = (long)iVar15;
      if (iVar15 <= iVar16) {
        do {
          if (iVar4 <= iVar12) {
            psVar6 = (short *)(*(long *)(p_Var2 + lVar9 * 8) + (long)iVar4 * 0x40 + lVar5 * 2);
            iVar10 = (iVar12 - iVar4) + 1;
            do {
              if (*psVar6 != 0) {
                iVar13 = (int)lVar5;
                boxp->c2max = iVar13;
                goto LAB_00133556;
              }
              psVar6 = psVar6 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (iVar16 + 1 != (int)lVar9);
      }
      bVar3 = iVar8 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar3);
  }
LAB_00133556:
  JVar1 = cinfo->out_color_space;
  lVar5 = (long)((iVar16 - iVar15) * 8) * (long)c_scales[rgb_red[JVar1]];
  lVar9 = (long)((iVar12 - iVar4) * 4) * (long)c_scales[rgb_green[JVar1]];
  lVar17 = (long)((iVar13 - iVar8) * 8) * (long)c_scales[rgb_blue[JVar1]];
  boxp->volume = lVar17 * lVar17 + lVar9 * lVar9 + lVar5 * lVar5;
  if (iVar16 < iVar15) {
    lVar5 = 0;
  }
  else {
    lVar9 = (long)iVar15;
    lVar5 = 0;
    do {
      if (iVar4 <= iVar12) {
        lVar11 = *(long *)(p_Var2 + lVar9 * 8) + (long)iVar4 * 0x40 + (long)iVar8 * 2;
        lVar17 = (long)iVar4;
        do {
          if (iVar8 <= iVar13) {
            lVar7 = 0;
            do {
              lVar5 = (lVar5 + 1) - (ulong)(*(short *)(lVar11 + lVar7 * 2) == 0);
              lVar7 = lVar7 + 1;
            } while ((iVar13 - iVar8) + 1 != (int)lVar7);
          }
          lVar17 = lVar17 + 1;
          lVar11 = lVar11 + 0x40;
        } while (iVar12 + 1 != (int)lVar17);
      }
      lVar9 = lVar9 + 1;
    } while (iVar16 + 1 != (int)lVar9);
  }
  boxp->colorcount = lVar5;
  return;
}

Assistant:

LOCAL(void)
update_box(j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0, c1, c2;
  int c0min, c0max, c1min, c1max, c2min, c2max;
  JLONG dist0, dist1, dist2;
  long ccount;

  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;

  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0min = c0min = c0;
            goto have_c0min;
          }
      }
have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c0max = c0max = c0;
            goto have_c0max;
          }
      }
have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1min = c1min = c1;
            goto have_c1min;
          }
      }
have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1][c2min];
        for (c2 = c2min; c2 <= c2max; c2++)
          if (*histp++ != 0) {
            boxp->c1max = c1max = c1;
            goto have_c1max;
          }
      }
have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2min = c2min = c2;
            goto have_c2min;
          }
      }
have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
        histp = &histogram[c0][c1min][c2];
        for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
          if (*histp != 0) {
            boxp->c2max = c2max = c2;
            goto have_c2max;
          }
      }
have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = &histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
        if (*histp != 0) {
          ccount++;
        }
    }
  boxp->colorcount = ccount;
}